

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int rtosc_count_printed_arg_vals_of_msg(char *msg)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ulong in_RAX;
  ushort **ppuVar4;
  undefined8 uStack_28;
  
  cVar2 = *msg;
  uStack_28 = in_RAX;
  while (cVar2 != '\0') {
    iVar3 = isspace((int)cVar2);
    if (iVar3 == 0) break;
    pcVar1 = msg + 1;
    msg = msg + 1;
    cVar2 = *pcVar1;
  }
  while( true ) {
    cVar2 = *msg;
    if (cVar2 != '%') break;
    uStack_28 = uStack_28 & 0xffffffff;
    __isoc99_sscanf(msg,"%*[^\n] %n",(long)&uStack_28 + 4);
    msg = msg + uStack_28._4_4_;
  }
  if (cVar2 == '\0') {
    iVar3 = -0x80000000;
  }
  else if (cVar2 == '/') {
    cVar2 = *msg;
    if (cVar2 != '\0') {
      ppuVar4 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 0x20) != 0) break;
        cVar2 = msg[1];
        msg = msg + 1;
      } while (cVar2 != '\0');
    }
    iVar3 = rtosc_count_printed_arg_vals(msg);
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int rtosc_count_printed_arg_vals_of_msg(const char* msg)
{
    skip_while(&msg, isspace);
    while (*msg == '%')
        skip_fmt(&msg, "%*[^\n] %n");

    if (*msg == '/') {
        for(; *msg && !isspace(*msg); ++msg);
        return rtosc_count_printed_arg_vals(msg);
    }
    else if(!*msg)
        return INT_MIN;
    else
        return -1;
}